

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCapsuleShape.cpp
# Opt level: O2

void __thiscall chrono::ChCapsuleShape::ArchiveIN(ChCapsuleShape *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::geometry::ChCapsule> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChCapsuleShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gcapsule;
  local_28._name = "gcapsule";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChCapsuleShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChCapsuleShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gcapsule);
}